

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qproperty_p.h
# Opt level: O0

void __thiscall QPropertyObserverPointer::unlink_fast(QPropertyObserverPointer *this)

{
  QPropertyObserverPointer *in_stack_00000010;
  
  unlink_common(in_stack_00000010);
  return;
}

Assistant:

void unlink_fast()
    {
#if QT_DEPRECATED_SINCE(6, 6)
        QT_WARNING_PUSH QT_WARNING_DISABLE_DEPRECATED
        Q_ASSERT(ptr->next.tag() != QPropertyObserver::ObserverIsAlias);
        QT_WARNING_POP
#endif
        unlink_common();
    }